

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  BufferMode BVar2;
  Context *pCVar3;
  char *__s;
  _func_int **pp_Var4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int extraout_EAX;
  TestNode *pTVar8;
  TestNode *pTVar9;
  long *plVar10;
  long lVar11;
  anon_struct_16_2_3f8b7511 *paVar12;
  undefined8 extraout_RAX;
  anon_struct_16_2_f7718127 *paVar13;
  UniformBlockCase *pUVar14;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  TestNode *pTVar15;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  uint uVar16;
  long *plVar17;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  uint uVar22;
  string baseName;
  VarType local_140;
  long lStack_128;
  TestNode *local_120;
  VarType local_118;
  long lStack_100;
  TestNode *local_f8;
  TestNode *local_f0;
  TestNode *local_e8;
  anon_struct_16_2_3f8b7511 *local_e0;
  anon_struct_16_2_f7718127 *local_d8;
  TestNode *local_d0;
  anon_struct_16_2_f7718127 *local_c8;
  TestNode *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  uint local_98;
  allocator<char> local_91;
  TestNode *local_90;
  VarType local_88;
  long lStack_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  VarType local_48;
  
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_type","Single basic variable in single buffer");
  local_90 = pTVar8;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar11 = 0;
  local_f0 = (TestNode *)this;
  do {
    pTVar8 = (TestNode *)operator_new(0x70);
    local_c0 = (TestNode *)lVar11;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,init::layoutFlags[lVar11].name,
               "");
    local_d8 = init::layoutFlags + lVar11;
    tcu::TestNode::addChild(local_90,pTVar8);
    uVar19 = 0;
    local_f8 = pTVar8;
    do {
      pTVar8 = local_f8;
      DVar1 = init::basicTypes[uVar19];
      local_d0 = (TestNode *)uVar19;
      pTVar9 = (TestNode *)glu::getDataTypeName(DVar1);
      local_120 = (TestNode *)(ulong)DVar1;
      local_e8 = pTVar9;
      if (DVar1 - TYPE_BOOL < 4) {
        pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        deqp::gls::ub::VarType::VarType(&local_118,DVar1,0);
        local_e0 = (anon_struct_16_2_3f8b7511 *)CONCAT44(local_e0._4_4_,local_d8->flags);
        createBlockBasicTypeCases
                  ((TestCaseGroup *)pTVar8,pCVar3,(char *)pTVar9,&local_118,local_d8->flags,0);
        deqp::gls::ub::VarType::~VarType(&local_118);
      }
      else {
        lVar11 = 8;
        do {
          pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,*(char **)(&UNK_00cfdba8 + lVar11),
                     (allocator<char> *)local_68);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_140._0_8_ = (long)&local_140 + 0x10;
          plVar17 = plVar10 + 2;
          if ((long *)*plVar10 == plVar17) {
            local_140.m_data._8_8_ = *plVar17;
            lStack_128 = plVar10[3];
          }
          else {
            local_140.m_data._8_8_ = *plVar17;
            local_140._0_8_ = (long *)*plVar10;
          }
          local_140.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
          local_118._0_8_ = (long)&local_118 + 0x10;
          plVar17 = plVar10 + 2;
          if ((long *)*plVar10 == plVar17) {
            local_118.m_data._8_8_ = *plVar17;
            lStack_100 = plVar10[3];
          }
          else {
            local_118.m_data._8_8_ = *plVar17;
            local_118._0_8_ = (long *)*plVar10;
          }
          uVar18 = local_118._0_8_;
          local_118.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          deqp::gls::ub::VarType::VarType
                    (&local_88,(DataType)local_120,
                     *(deUint32 *)((long)&init::precisionFlags[0].name + lVar11));
          local_e0 = (anon_struct_16_2_3f8b7511 *)CONCAT44(local_e0._4_4_,local_d8->flags);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_f8,pCVar3,(char *)uVar18,&local_88,local_d8->flags,0);
          deqp::gls::ub::VarType::~VarType(&local_88);
          if (local_118._0_8_ != (long)&local_118 + 0x10U) {
            operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
          }
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0x38);
      }
      uVar16 = (int)local_120 - 0x12;
      if ((int)local_120 - 5U < 9 || uVar16 < 9) {
        uVar18 = CONCAT71((uint7)(uint3)(uVar16 >> 8),1);
        lVar11 = 0;
        do {
          local_c8 = (anon_struct_16_2_f7718127 *)CONCAT44(local_c8._4_4_,(int)uVar18);
          __s = init::matrixFlags[lVar11].name;
          lVar20 = 8;
          do {
            pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::__cxx11::string::string<std::allocator<char>>((string *)local_68,__s,&local_91);
            plVar10 = (long *)std::__cxx11::string::append((char *)local_68);
            local_88._0_8_ = (long)&local_88 + 0x10;
            plVar17 = plVar10 + 2;
            if ((long *)*plVar10 == plVar17) {
              local_88.m_data._8_8_ = *plVar17;
              lStack_70 = plVar10[3];
            }
            else {
              local_88.m_data._8_8_ = *plVar17;
              local_88._0_8_ = (long *)*plVar10;
            }
            local_88.m_data.array.elementType = (VarType *)plVar10[1];
            *plVar10 = (long)plVar17;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_88);
            local_b8 = &local_a8;
            plVar17 = plVar10 + 2;
            if ((long *)*plVar10 == plVar17) {
              local_a8 = *plVar17;
              lStack_a0 = plVar10[3];
            }
            else {
              local_a8 = *plVar17;
              local_b8 = (long *)*plVar10;
            }
            local_b0 = plVar10[1];
            *plVar10 = (long)plVar17;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
            local_140._0_8_ = (long)&local_140 + 0x10;
            plVar17 = plVar10 + 2;
            if ((long *)*plVar10 == plVar17) {
              local_140.m_data._8_8_ = *plVar17;
              lStack_128 = plVar10[3];
            }
            else {
              local_140.m_data._8_8_ = *plVar17;
              local_140._0_8_ = (long *)*plVar10;
            }
            local_140.m_data.array.elementType = (VarType *)plVar10[1];
            *plVar10 = (long)plVar17;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
            local_118._0_8_ = (long)&local_118 + 0x10;
            plVar17 = plVar10 + 2;
            if ((long *)*plVar10 == plVar17) {
              local_118.m_data._8_8_ = *plVar17;
              lStack_100 = plVar10[3];
            }
            else {
              local_118.m_data._8_8_ = *plVar17;
              local_118._0_8_ = (long *)*plVar10;
            }
            uVar18 = local_118._0_8_;
            local_118.m_data.array.elementType = (VarType *)plVar10[1];
            *plVar10 = (long)plVar17;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            deqp::gls::ub::VarType::VarType
                      (&local_48,(DataType)local_120,
                       *(deUint32 *)((long)&init::precisionFlags[0].name + lVar20));
            createBlockBasicTypeCases
                      ((TestCaseGroup *)local_f8,pCVar3,(char *)uVar18,&local_48,
                       init::matrixFlags[lVar11].flags | (BufferMode)local_e0,0);
            deqp::gls::ub::VarType::~VarType(&local_48);
            if (local_118._0_8_ != (long)&local_118 + 0x10U) {
              operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
            }
            this = (UniformBlockTests *)local_f0;
            if (local_140._0_8_ != (long)&local_140 + 0x10U) {
              operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
            }
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,local_a8 + 1);
            }
            if (local_88._0_8_ != (long)&local_88 + 0x10U) {
              operator_delete((void *)local_88._0_8_,local_88.m_data._8_8_ + 1);
            }
            if (local_68[0] != (undefined1 *)((long)&((VarType *)local_68)->m_data + 8U)) {
              operator_delete(local_68[0],local_58._0_8_ + 1);
            }
            lVar20 = lVar20 + 0x10;
          } while (lVar20 != 0x38);
          lVar11 = 1;
          uVar18 = 0;
        } while (((ulong)local_c8 & 1) != 0);
      }
      uVar19 = (long)local_d0 + 1;
    } while (uVar19 != 0x19);
    lVar11 = (long)local_c0 + 1;
  } while (lVar11 != 3);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,"single_basic_array",
             "Single basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  uVar19 = 0;
  local_c0 = pTVar8;
  do {
    pTVar8 = local_c0;
    pTVar9 = (TestNode *)operator_new(0x70);
    local_d0 = (TestNode *)uVar19;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,((TestNode *)this)->m_testCtx,init::layoutFlags[uVar19].name,
               "");
    local_d8 = init::layoutFlags + uVar19;
    local_f8 = pTVar9;
    tcu::TestNode::addChild(pTVar8,pTVar9);
    paVar13 = (anon_struct_16_2_f7718127 *)0x0;
    do {
      DVar1 = init::basicTypes[(long)paVar13];
      local_c8 = paVar13;
      paVar12 = (anon_struct_16_2_3f8b7511 *)glu::getDataTypeName(DVar1);
      pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      local_120 = (TestNode *)(ulong)DVar1;
      deqp::gls::ub::VarType::VarType(&local_140,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      deqp::gls::ub::VarType::VarType(&local_118,&local_140,3);
      local_e8 = (TestNode *)CONCAT44(local_e8._4_4_,local_d8->flags);
      createBlockBasicTypeCases
                ((TestCaseGroup *)local_f8,pCVar3,(char *)paVar12,&local_118,local_d8->flags,0);
      deqp::gls::ub::VarType::~VarType(&local_118);
      deqp::gls::ub::VarType::~VarType(&local_140);
      if ((int)local_120 - 5U < 9 || (int)local_120 - 0x12U < 9) {
        lVar11 = 0;
        bVar7 = true;
        local_e0 = paVar12;
        do {
          bVar21 = bVar7;
          pCVar3 = (Context *)local_f0[1]._vptr_TestNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,init::matrixFlags[lVar11].name,(allocator<char> *)&local_48
                    );
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_140._0_8_ = (long)&local_140 + 0x10;
          plVar17 = plVar10 + 2;
          if ((long *)*plVar10 == plVar17) {
            local_140.m_data._8_8_ = *plVar17;
            lStack_128 = plVar10[3];
          }
          else {
            local_140.m_data._8_8_ = *plVar17;
            local_140._0_8_ = (long *)*plVar10;
          }
          local_140.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
          local_118._0_8_ = (long)&local_118 + 0x10;
          plVar17 = plVar10 + 2;
          if ((long *)*plVar10 == plVar17) {
            local_118.m_data._8_8_ = *plVar17;
            lStack_100 = plVar10[3];
          }
          else {
            local_118.m_data._8_8_ = *plVar17;
            local_118._0_8_ = (long *)*plVar10;
          }
          uVar18 = local_118._0_8_;
          local_118.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          deqp::gls::ub::VarType::VarType((VarType *)local_68,(DataType)local_120,4);
          deqp::gls::ub::VarType::VarType(&local_88,(VarType *)local_68,3);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_f8,pCVar3,(char *)uVar18,&local_88,
                     init::matrixFlags[lVar11].flags | (uint)local_e8,0);
          deqp::gls::ub::VarType::~VarType(&local_88);
          deqp::gls::ub::VarType::~VarType((VarType *)local_68);
          if (local_118._0_8_ != (long)&local_118 + 0x10U) {
            operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
          }
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          lVar11 = 1;
          bVar7 = false;
        } while (bVar21);
      }
      pTVar8 = local_f0;
      paVar13 = (anon_struct_16_2_f7718127 *)((long)&local_c8->name + 1);
      this = (UniformBlockTests *)local_f0;
    } while (paVar13 != (anon_struct_16_2_f7718127 *)0x19);
    uVar19 = (long)local_d0 + 1;
  } while (uVar19 != 3);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"single_struct",
             "Single struct in uniform block");
  local_c0 = pTVar9;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  uVar18 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  lVar11 = 0;
  do {
    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)uVar18);
    pTVar9 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,init::bufferModes[lVar11].name,"");
    local_f8 = pTVar9;
    tcu::TestNode::addChild(local_c0,pTVar9);
    paVar13 = (anon_struct_16_2_f7718127 *)0x0;
    local_e0 = init::bufferModes + lVar11;
    do {
      local_c8 = init::layoutFlags + (long)paVar13;
      local_e8 = (TestNode *)init::layoutFlags[(long)paVar13].name;
      bVar7 = false;
      local_d8 = paVar13;
      bVar21 = true;
      do {
        bVar6 = bVar21;
        paVar12 = local_e0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,(char *)local_e8,(allocator<char> *)&local_140);
        BVar2 = paVar12->mode;
        if (bVar7 || BVar2 != BUFFERMODE_SINGLE) {
          local_120 = (TestNode *)CONCAT44(local_120._4_4_,local_c8->flags);
          if (!bVar6) {
            std::__cxx11::string::append((char *)&local_118);
          }
          pUVar14 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var4 = pTVar8[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
          iVar5 = (uint)(byte)~bVar6 * 3;
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfdcc8;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x100;
          *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
          pTVar8 = local_f0;
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          pUVar14 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var4 = pTVar8[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfdcc8;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x200;
          *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          pTVar8 = local_f0;
          if (((ulong)local_120 & 0x10) == 0) {
            pUVar14 = (UniformBlockCase *)operator_new(0xb8);
            pp_Var4 = pTVar8[1]._vptr_TestNode;
            local_140._0_8_ = (long)&local_140 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,local_118._0_8_,
                       (char *)(local_118._0_8_ +
                               (long)&(local_118.m_data.array.elementType)->m_type));
            std::__cxx11::string::append((char *)&local_140);
            deqp::gls::UniformBlockCase::UniformBlockCase
                      (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                       (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
            (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_00cfdcc8;
            *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_120 | 0x300;
            *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
            tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
            pTVar8 = local_f0;
            if (local_140._0_8_ != (long)&local_140 + 0x10U) {
              operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
              pTVar8 = local_f0;
            }
          }
        }
        if (local_118._0_8_ != (long)&local_118 + 0x10U) {
          operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
        }
        bVar7 = true;
        bVar21 = false;
      } while (bVar6);
      paVar13 = (anon_struct_16_2_f7718127 *)((long)&local_d8->name + 1);
    } while (paVar13 != (anon_struct_16_2_f7718127 *)0x3);
    lVar11 = 1;
    uVar18 = 0;
  } while (((ulong)local_d0 & 1) != 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"single_struct_array",
             "Struct array in one uniform block");
  local_c0 = pTVar9;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  uVar18 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
  lVar11 = 0;
  do {
    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)uVar18);
    pTVar9 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,init::bufferModes[lVar11].name,"");
    local_f8 = pTVar9;
    tcu::TestNode::addChild(local_c0,pTVar9);
    paVar13 = (anon_struct_16_2_f7718127 *)0x0;
    local_e0 = init::bufferModes + lVar11;
    do {
      local_c8 = init::layoutFlags + (long)paVar13;
      local_e8 = (TestNode *)init::layoutFlags[(long)paVar13].name;
      bVar7 = false;
      local_d8 = paVar13;
      bVar21 = true;
      do {
        bVar6 = bVar21;
        paVar12 = local_e0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,(char *)local_e8,(allocator<char> *)&local_140);
        BVar2 = paVar12->mode;
        if (bVar7 || BVar2 != BUFFERMODE_SINGLE) {
          local_120 = (TestNode *)CONCAT44(local_120._4_4_,local_c8->flags);
          if (!bVar6) {
            std::__cxx11::string::append((char *)&local_118);
          }
          pUVar14 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var4 = pTVar8[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
          iVar5 = (uint)(byte)~bVar6 * 3;
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfdd18;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x100;
          *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
          pTVar8 = local_f0;
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          pUVar14 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var4 = pTVar8[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfdd18;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x200;
          *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          pTVar8 = local_f0;
          if (((ulong)local_120 & 0x10) == 0) {
            pUVar14 = (UniformBlockCase *)operator_new(0xb8);
            pp_Var4 = pTVar8[1]._vptr_TestNode;
            local_140._0_8_ = (long)&local_140 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,local_118._0_8_,
                       (char *)(local_118._0_8_ +
                               (long)&(local_118.m_data.array.elementType)->m_type));
            std::__cxx11::string::append((char *)&local_140);
            deqp::gls::UniformBlockCase::UniformBlockCase
                      (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                       (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
            (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_00cfdd18;
            *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_120 | 0x300;
            *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
            tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
            pTVar8 = local_f0;
            if (local_140._0_8_ != (long)&local_140 + 0x10U) {
              operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
              pTVar8 = local_f0;
            }
          }
        }
        if (local_118._0_8_ != (long)&local_118 + 0x10U) {
          operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
        }
        bVar7 = true;
        bVar21 = false;
      } while (bVar6);
      paVar13 = (anon_struct_16_2_f7718127 *)((long)&local_d8->name + 1);
    } while (paVar13 != (anon_struct_16_2_f7718127 *)0x3);
    lVar11 = 1;
    uVar18 = 0;
  } while (((ulong)local_d0 & 1) != 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"single_nested_struct",
             "Nested struct in one uniform block");
  local_c0 = pTVar9;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  uVar18 = CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
  lVar11 = 0;
  do {
    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)uVar18);
    pTVar9 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,init::bufferModes[lVar11].name,"");
    local_f8 = pTVar9;
    tcu::TestNode::addChild(local_c0,pTVar9);
    paVar13 = (anon_struct_16_2_f7718127 *)0x0;
    local_e0 = init::bufferModes + lVar11;
    do {
      local_c8 = init::layoutFlags + (long)paVar13;
      local_e8 = (TestNode *)init::layoutFlags[(long)paVar13].name;
      bVar7 = false;
      local_d8 = paVar13;
      bVar21 = true;
      do {
        bVar6 = bVar21;
        paVar12 = local_e0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,(char *)local_e8,(allocator<char> *)&local_140);
        BVar2 = paVar12->mode;
        if (bVar7 || BVar2 != BUFFERMODE_SINGLE) {
          local_120 = (TestNode *)CONCAT44(local_120._4_4_,local_c8->flags);
          if (!bVar6) {
            std::__cxx11::string::append((char *)&local_118);
          }
          pUVar14 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var4 = pTVar8[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
          iVar5 = (uint)(byte)~bVar6 * 3;
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfdd68;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x100;
          *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
          pTVar8 = local_f0;
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          pUVar14 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var4 = pTVar8[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfdd68;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x200;
          *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          pTVar8 = local_f0;
          if (((ulong)local_120 & 0x10) == 0) {
            pUVar14 = (UniformBlockCase *)operator_new(0xb8);
            pp_Var4 = pTVar8[1]._vptr_TestNode;
            local_140._0_8_ = (long)&local_140 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,local_118._0_8_,
                       (char *)(local_118._0_8_ +
                               (long)&(local_118.m_data.array.elementType)->m_type));
            std::__cxx11::string::append((char *)&local_140);
            deqp::gls::UniformBlockCase::UniformBlockCase
                      (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                       (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
            (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_00cfdd68;
            *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_120 | 0x300;
            *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
            tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
            pTVar8 = local_f0;
            if (local_140._0_8_ != (long)&local_140 + 0x10U) {
              operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
              pTVar8 = local_f0;
            }
          }
        }
        if (local_118._0_8_ != (long)&local_118 + 0x10U) {
          operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
        }
        bVar7 = true;
        bVar21 = false;
      } while (bVar6);
      paVar13 = (anon_struct_16_2_f7718127 *)((long)&local_d8->name + 1);
    } while (paVar13 != (anon_struct_16_2_f7718127 *)0x3);
    lVar11 = 1;
    uVar18 = 0;
  } while (((ulong)local_d0 & 1) != 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"single_nested_struct_array",
             "Nested struct array in one uniform block");
  local_c0 = pTVar9;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  uVar18 = CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
  lVar11 = 0;
  do {
    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)uVar18);
    pTVar9 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,init::bufferModes[lVar11].name,"");
    local_f8 = pTVar9;
    tcu::TestNode::addChild(local_c0,pTVar9);
    paVar13 = (anon_struct_16_2_f7718127 *)0x0;
    local_e0 = init::bufferModes + lVar11;
    do {
      local_c8 = init::layoutFlags + (long)paVar13;
      local_e8 = (TestNode *)init::layoutFlags[(long)paVar13].name;
      bVar7 = false;
      local_d8 = paVar13;
      bVar21 = true;
      do {
        bVar6 = bVar21;
        paVar12 = local_e0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,(char *)local_e8,(allocator<char> *)&local_140);
        BVar2 = paVar12->mode;
        if (bVar7 || BVar2 != BUFFERMODE_SINGLE) {
          local_120 = (TestNode *)CONCAT44(local_120._4_4_,local_c8->flags);
          if (!bVar6) {
            std::__cxx11::string::append((char *)&local_118);
          }
          pUVar14 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var4 = pTVar8[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
          iVar5 = (uint)(byte)~bVar6 * 3;
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfddb8;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x100;
          *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
          pTVar8 = local_f0;
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          pUVar14 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var4 = pTVar8[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfddb8;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x200;
          *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          pTVar8 = local_f0;
          if (((ulong)local_120 & 0x10) == 0) {
            pUVar14 = (UniformBlockCase *)operator_new(0xb8);
            pp_Var4 = pTVar8[1]._vptr_TestNode;
            local_140._0_8_ = (long)&local_140 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,local_118._0_8_,
                       (char *)(local_118._0_8_ +
                               (long)&(local_118.m_data.array.elementType)->m_type));
            std::__cxx11::string::append((char *)&local_140);
            deqp::gls::UniformBlockCase::UniformBlockCase
                      (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                       (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,BVar2);
            (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_00cfddb8;
            *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_120 | 0x300;
            *(int *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar5;
            tcu::TestNode::addChild(local_f8,(TestNode *)pUVar14);
            pTVar8 = local_f0;
            if (local_140._0_8_ != (long)&local_140 + 0x10U) {
              operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
              pTVar8 = local_f0;
            }
          }
        }
        if (local_118._0_8_ != (long)&local_118 + 0x10U) {
          operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
        }
        bVar7 = true;
        bVar21 = false;
      } while (bVar6);
      paVar13 = (anon_struct_16_2_f7718127 *)((long)&local_d8->name + 1);
    } while (paVar13 != (anon_struct_16_2_f7718127 *)0x3);
    lVar11 = 1;
    uVar18 = 0;
  } while (((ulong)local_d0 & 1) != 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"instance_array_basic_type",
             "Single basic variable in instance array");
  tcu::TestNode::addChild(pTVar8,pTVar9);
  paVar13 = (anon_struct_16_2_f7718127 *)0x0;
  local_d0 = pTVar9;
  do {
    pTVar9 = local_d0;
    pTVar15 = (TestNode *)operator_new(0x70);
    local_d8 = paVar13;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar15,pTVar8->m_testCtx,init::layoutFlags[(long)paVar13].name,"");
    local_c8 = init::layoutFlags + (long)paVar13;
    local_120 = pTVar15;
    tcu::TestNode::addChild(pTVar9,pTVar15);
    paVar12 = (anon_struct_16_2_3f8b7511 *)0x0;
    do {
      DVar1 = init::basicTypes[(long)paVar12];
      local_e0 = paVar12;
      pTVar9 = (TestNode *)glu::getDataTypeName(DVar1);
      pCVar3 = (Context *)pTVar8[1]._vptr_TestNode;
      deqp::gls::ub::VarType::VarType(&local_118,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      local_e8 = (TestNode *)CONCAT44(local_e8._4_4_,local_c8->flags);
      local_f8 = pTVar9;
      createBlockBasicTypeCases
                ((TestCaseGroup *)local_120,pCVar3,(char *)pTVar9,&local_118,local_c8->flags,3);
      deqp::gls::ub::VarType::~VarType(&local_118);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar11 = 0;
        bVar7 = true;
        do {
          bVar21 = bVar7;
          pCVar3 = (Context *)pTVar8[1]._vptr_TestNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,init::matrixFlags[lVar11].name,(allocator<char> *)local_68)
          ;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_140._0_8_ = (long)&local_140 + 0x10;
          plVar17 = plVar10 + 2;
          if ((long *)*plVar10 == plVar17) {
            local_140.m_data._8_8_ = *plVar17;
            lStack_128 = plVar10[3];
          }
          else {
            local_140.m_data._8_8_ = *plVar17;
            local_140._0_8_ = (long *)*plVar10;
          }
          local_140.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
          local_118._0_8_ = (long)&local_118 + 0x10;
          plVar17 = plVar10 + 2;
          if ((long *)*plVar10 == plVar17) {
            local_118.m_data._8_8_ = *plVar17;
            lStack_100 = plVar10[3];
          }
          else {
            local_118.m_data._8_8_ = *plVar17;
            local_118._0_8_ = (long *)*plVar10;
          }
          uVar18 = local_118._0_8_;
          local_118.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          deqp::gls::ub::VarType::VarType(&local_88,DVar1,4);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_120,pCVar3,(char *)uVar18,&local_88,
                     init::matrixFlags[lVar11].flags | (uint)local_e8,3);
          deqp::gls::ub::VarType::~VarType(&local_88);
          if (local_118._0_8_ != (long)&local_118 + 0x10U) {
            operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
          }
          pTVar8 = local_f0;
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          lVar11 = 1;
          bVar7 = false;
        } while (bVar21);
      }
      paVar12 = (anon_struct_16_2_3f8b7511 *)((long)&local_e0->name + 1);
    } while (paVar12 != (anon_struct_16_2_3f8b7511 *)0x19);
    paVar13 = (anon_struct_16_2_f7718127 *)((long)&local_d8->name + 1);
  } while (paVar13 != (anon_struct_16_2_f7718127 *)0x3);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"multi_basic_types",
             "Multiple buffers with basic types");
  tcu::TestNode::addChild(pTVar8,pTVar9);
  uVar18 = CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),1);
  lVar11 = 0;
  local_c0 = pTVar9;
  do {
    local_98 = (uint)uVar18;
    pTVar15 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar15,pTVar8->m_testCtx,init::bufferModes[lVar11].name,"");
    local_d0 = (TestNode *)(init::bufferModes + lVar11);
    local_e8 = pTVar15;
    tcu::TestNode::addChild(pTVar9,pTVar15);
    pTVar15 = (TestNode *)0x0;
    do {
      local_d8 = init::layoutFlags + (long)pTVar15;
      local_c8 = (anon_struct_16_2_f7718127 *)init::layoutFlags[(long)pTVar15].name;
      local_f8 = (TestNode *)CONCAT44(local_f8._4_4_,(int)CONCAT71((int7)((ulong)local_c8 >> 8),1));
      local_90 = pTVar15;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,(char *)local_c8,(allocator<char> *)&local_140);
        local_120 = (TestNode *)CONCAT44(local_120._4_4_,local_d8->flags);
        if (((ulong)local_f8 & 1) == 0) {
          std::__cxx11::string::append((char *)&local_118);
        }
        pUVar14 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var4 = local_f0[1]._vptr_TestNode;
        local_140._0_8_ = (long)&local_140 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_118._0_8_,
                   (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_140);
        local_e0 = (anon_struct_16_2_3f8b7511 *)
                   CONCAT44(local_e0._4_4_,*(BufferMode *)&local_d0->m_testCtx);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                   (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,
                   *(BufferMode *)&local_d0->m_testCtx);
        uVar16 = (uint)local_120 | 0x100;
        iVar5 = ((byte)~(byte)local_f8 & 1) * 3;
        (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_00cfde08;
        *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode = uVar16;
        *(uint *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar16;
        *(int *)&pUVar14[1].super_TestCase.super_TestNode.m_testCtx = iVar5;
        tcu::TestNode::addChild(local_e8,(TestNode *)pUVar14);
        if (local_140._0_8_ != (long)&local_140 + 0x10U) {
          operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
        }
        pUVar14 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var4 = local_f0[1]._vptr_TestNode;
        local_140._0_8_ = (long)&local_140 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_118._0_8_,
                   (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_140);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                   (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,(BufferMode)local_e0);
        uVar22 = (uint)local_120 | 0x200;
        (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_00cfde08;
        *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode = uVar22;
        *(uint *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar22;
        *(int *)&pUVar14[1].super_TestCase.super_TestNode.m_testCtx = iVar5;
        tcu::TestNode::addChild(local_e8,(TestNode *)pUVar14);
        if (local_140._0_8_ != (long)&local_140 + 0x10U) {
          operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
        }
        if (((ulong)local_120 & 0x10) == 0) {
          pUVar14 = (UniformBlockCase *)operator_new(0xc0);
          pp_Var4 = local_f0[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,(BufferMode)local_e0);
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfde08;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x300;
          *(uint *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
               (uint)local_120 | 0x300;
          *(int *)&pUVar14[1].super_TestCase.super_TestNode.m_testCtx = iVar5;
          tcu::TestNode::addChild(local_e8,(TestNode *)pUVar14);
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
        }
        pUVar14 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var4 = local_f0[1]._vptr_TestNode;
        local_140._0_8_ = (long)&local_140 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_118._0_8_,
                   (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_140);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                   (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,(BufferMode)local_e0);
        (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_00cfde08;
        *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode = uVar16;
        *(uint *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar22;
        *(int *)&pUVar14[1].super_TestCase.super_TestNode.m_testCtx = iVar5;
        tcu::TestNode::addChild(local_e8,(TestNode *)pUVar14);
        if (local_140._0_8_ != (long)&local_140 + 0x10U) {
          operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
        }
        pTVar9 = local_c0;
        pTVar8 = local_f0;
        if (local_118._0_8_ != (long)&local_118 + 0x10U) {
          operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
        }
        uVar19 = (ulong)local_f8 & 1;
        local_f8 = (TestNode *)((ulong)local_f8 & 0xffffffff00000000);
      } while (uVar19 != 0);
      pTVar15 = (TestNode *)((long)&local_90->_vptr_TestNode + 1);
    } while (pTVar15 != (TestNode *)0x3);
    lVar11 = 1;
    uVar18 = 0;
  } while ((local_98 & 1) != 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"multi_nested_struct",
             "Multiple buffers with nested structs");
  tcu::TestNode::addChild(pTVar8,pTVar9);
  uVar18 = CONCAT71((int7)((ulong)extraout_RAX_04 >> 8),1);
  lVar11 = 0;
  local_c0 = pTVar9;
  do {
    local_98 = (uint)uVar18;
    pTVar15 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar15,pTVar8->m_testCtx,init::bufferModes[lVar11].name,"");
    local_d0 = (TestNode *)(init::bufferModes + lVar11);
    local_e8 = pTVar15;
    tcu::TestNode::addChild(pTVar9,pTVar15);
    pTVar15 = (TestNode *)0x0;
    do {
      local_d8 = init::layoutFlags + (long)pTVar15;
      local_c8 = (anon_struct_16_2_f7718127 *)init::layoutFlags[(long)pTVar15].name;
      local_f8 = (TestNode *)CONCAT44(local_f8._4_4_,(int)CONCAT71((int7)((ulong)local_c8 >> 8),1));
      local_90 = pTVar15;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,(char *)local_c8,(allocator<char> *)&local_140);
        local_120 = (TestNode *)CONCAT44(local_120._4_4_,local_d8->flags);
        if (((ulong)local_f8 & 1) == 0) {
          std::__cxx11::string::append((char *)&local_118);
        }
        pUVar14 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var4 = local_f0[1]._vptr_TestNode;
        local_140._0_8_ = (long)&local_140 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_118._0_8_,
                   (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_140);
        local_e0 = (anon_struct_16_2_3f8b7511 *)
                   CONCAT44(local_e0._4_4_,*(BufferMode *)&local_d0->m_testCtx);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                   (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,
                   *(BufferMode *)&local_d0->m_testCtx);
        uVar16 = (uint)local_120 | 0x100;
        iVar5 = ((byte)~(byte)local_f8 & 1) * 3;
        (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_00cfde58;
        *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode = uVar16;
        *(uint *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar16;
        *(int *)&pUVar14[1].super_TestCase.super_TestNode.m_testCtx = iVar5;
        tcu::TestNode::addChild(local_e8,(TestNode *)pUVar14);
        if (local_140._0_8_ != (long)&local_140 + 0x10U) {
          operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
        }
        pUVar14 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var4 = local_f0[1]._vptr_TestNode;
        local_140._0_8_ = (long)&local_140 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_118._0_8_,
                   (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_140);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                   (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,(BufferMode)local_e0);
        uVar22 = (uint)local_120 | 0x200;
        (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_00cfde58;
        *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode = uVar22;
        *(uint *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar22;
        *(int *)&pUVar14[1].super_TestCase.super_TestNode.m_testCtx = iVar5;
        tcu::TestNode::addChild(local_e8,(TestNode *)pUVar14);
        if (local_140._0_8_ != (long)&local_140 + 0x10U) {
          operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
        }
        if (((ulong)local_120 & 0x10) == 0) {
          pUVar14 = (UniformBlockCase *)operator_new(0xc0);
          pp_Var4 = local_f0[1]._vptr_TestNode;
          local_140._0_8_ = (long)&local_140 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_118._0_8_,
                     (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_140);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                     (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,(BufferMode)local_e0);
          (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00cfde58;
          *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_120 | 0x300;
          *(uint *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
               (uint)local_120 | 0x300;
          *(int *)&pUVar14[1].super_TestCase.super_TestNode.m_testCtx = iVar5;
          tcu::TestNode::addChild(local_e8,(TestNode *)pUVar14);
          if (local_140._0_8_ != (long)&local_140 + 0x10U) {
            operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
          }
        }
        pUVar14 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var4 = local_f0[1]._vptr_TestNode;
        local_140._0_8_ = (long)&local_140 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_118._0_8_,
                   (char *)(local_118._0_8_ + (long)&(local_118.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_140);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],
                   (char *)local_140._0_8_,"",GLSL_VERSION_300_ES,(BufferMode)local_e0);
        (pUVar14->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_00cfde58;
        *(uint *)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode = uVar16;
        *(uint *)((long)&pUVar14[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar22;
        *(int *)&pUVar14[1].super_TestCase.super_TestNode.m_testCtx = iVar5;
        tcu::TestNode::addChild(local_e8,(TestNode *)pUVar14);
        if (local_140._0_8_ != (long)&local_140 + 0x10U) {
          operator_delete((void *)local_140._0_8_,local_140.m_data._8_8_ + 1);
        }
        pTVar9 = local_c0;
        pTVar8 = local_f0;
        if (local_118._0_8_ != (long)&local_118 + 0x10U) {
          operator_delete((void *)local_118._0_8_,local_118.m_data._8_8_ + 1);
        }
        uVar19 = (ulong)local_f8 & 1;
        local_f8 = (TestNode *)((ulong)local_f8 & 0xffffffff00000000);
      } while (uVar19 != 0);
      pTVar15 = (TestNode *)((long)&local_90->_vptr_TestNode + 1);
    } while (pTVar15 != (TestNode *)0x3);
    lVar11 = 1;
    uVar18 = 0;
  } while ((local_98 & 1) != 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"random","Random Uniform Block cases");
  tcu::TestNode::addChild(pTVar8,pTVar9);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"scalar_types",
             "Scalar types only, per-block buffers",BUFFERMODE_PER_BLOCK,0x3fc0,0x19,0);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"vector_types",
             "Scalar and vector types only, per-block buffers",BUFFERMODE_PER_BLOCK,0x3fc1,0x19,0x19
            );
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"basic_types",
             "All basic types, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fc3,0x19,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"basic_arrays",
             "Arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fc7,0x19,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"basic_instance_arrays",
             "Basic instance arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fe3,0x19,0x4b);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"nested_structs",
             "Nested structs, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fcb,0x19,100);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"nested_structs_arrays",
             "Nested structs, arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fcf,0x19,0x96);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,
             "nested_structs_instance_arrays","Nested structs, instance arrays, per-block buffers",
             BUFFERMODE_PER_BLOCK,0x7feb,0x19,0x7d);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,
             "nested_structs_arrays_instance_arrays",
             "Nested structs, instance arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fef,0x19,
             0xaf);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"all_per_block_buffers",
             "All random features, per-block buffers",BUFFERMODE_PER_BLOCK,0xffff7fff,0x32,200);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar9,(Context *)pTVar8[1]._vptr_TestNode,"all_shared_buffer",
             "All random features, shared buffer",BUFFERMODE_SINGLE,0xffff7fff,0x32,0xfa);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init (void)
{
	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4,
		glu::TYPE_BOOL,
		glu::TYPE_BOOL_VEC2,
		glu::TYPE_BOOL_VEC3,
		glu::TYPE_BOOL_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} precisionFlags[] =
	{
		{ "lowp",		PRECISION_LOW		},
		{ "mediump",	PRECISION_MEDIUM	},
		{ "highp",		PRECISION_HIGH		}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} layoutFlags[] =
	{
		{ "shared",		LAYOUT_SHARED	},
		{ "packed",		LAYOUT_PACKED	},
		{ "std140",		LAYOUT_STD140	}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} matrixFlags[] =
	{
		{ "row_major",		LAYOUT_ROW_MAJOR	},
		{ "column_major",	LAYOUT_COLUMN_MAJOR }
	};

	static const struct
	{
		const char*							name;
		UniformBlockCase::BufferMode		mode;
	} bufferModes[] =
	{
		{ "per_block_buffer",	UniformBlockCase::BUFFERMODE_PER_BLOCK },
		{ "single_buffer",		UniformBlockCase::BUFFERMODE_SINGLE	}
	};

	// ubo.single_basic_type
	{
		tcu::TestCaseGroup* singleBasicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "single_basic_type", "Single basic variable in single buffer");
		addChild(singleBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*		typeName	= glu::getDataTypeName(type);

				if (glu::isDataTypeBoolOrBVec(type))
					createBlockBasicTypeCases(layoutGroup, m_context, typeName, VarType(type, 0), layoutFlags[layoutFlagNdx].flags);
				else
				{
					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(precisionFlags[precNdx].name) + "_" + typeName).c_str(),
												  VarType(type, precisionFlags[precNdx].flags), layoutFlags[layoutFlagNdx].flags);
				}

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
					{
						for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
							createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + precisionFlags[precNdx].name + "_" + typeName).c_str(),
													  VarType(type, precisionFlags[precNdx].flags), layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
					}
				}
			}
		}
	}

	// ubo.single_basic_array
	{
		tcu::TestCaseGroup* singleBasicArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_basic_array", "Single basic array variable in single buffer");
		addChild(singleBasicArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*		typeName	= glu::getDataTypeName(type);
				const int		arraySize	= 3;

				createBlockBasicTypeCases(layoutGroup, m_context, typeName,
										  VarType(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), arraySize),
										  layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  VarType(VarType(type, PRECISION_HIGH), arraySize),
												  layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.single_struct
	{
		tcu::TestCaseGroup* singleStructGroup = new tcu::TestCaseGroup(m_testCtx, "single_struct", "Single struct in uniform block");
		addChild(singleStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_struct_array
	{
		tcu::TestCaseGroup* singleStructArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_struct_array", "Struct array in one uniform block");
		addChild(singleStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleStructArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct
	{
		tcu::TestCaseGroup* singleNestedStructGroup = new tcu::TestCaseGroup(m_testCtx, "single_nested_struct", "Nested struct in one uniform block");
		addChild(singleNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct_array
	{
		tcu::TestCaseGroup* singleNestedStructArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_nested_struct_array", "Nested struct array in one uniform block");
		addChild(singleNestedStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleNestedStructArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.instance_array_basic_type
	{
		tcu::TestCaseGroup* instanceArrayBasicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "instance_array_basic_type", "Single basic variable in instance array");
		addChild(instanceArrayBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			instanceArrayBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type			= basicTypes[basicTypeNdx];
				const char*		typeName		= glu::getDataTypeName(type);
				const int		numInstances	= 3;

				createBlockBasicTypeCases(layoutGroup, m_context, typeName,
										  VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH),
										  layoutFlags[layoutFlagNdx].flags, numInstances);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  VarType(type, PRECISION_HIGH), layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags,
												  numInstances);
				}
			}
		}
	}

	// ubo.multi_basic_types
	{
		tcu::TestCaseGroup* multiBasicTypesGroup = new tcu::TestCaseGroup(m_testCtx, "multi_basic_types", "Multiple buffers with basic types");
		addChild(multiBasicTypesGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiBasicTypesGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));

					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_mixed").c_str(),		"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.multi_nested_struct
	{
		tcu::TestCaseGroup* multiNestedStructGroup = new tcu::TestCaseGroup(m_testCtx, "multi_nested_struct", "Multiple buffers with nested structs");
		addChild(multiNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));

					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_mixed").c_str(),	"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32	allShaders		= FEATURE_VERTEX_BLOCKS|FEATURE_FRAGMENT_BLOCKS|FEATURE_SHARED_BLOCKS;
		const deUint32	allLayouts		= FEATURE_PACKED_LAYOUT|FEATURE_SHARED_LAYOUT|FEATURE_STD140_LAYOUT;
		const deUint32	allBasicTypes	= FEATURE_VECTORS|FEATURE_MATRICES;
		const deUint32	unused			= FEATURE_UNUSED_MEMBERS|FEATURE_UNUSED_UNIFORMS;
		const deUint32	matFlags		= FEATURE_MATRIX_LAYOUT;
		const deUint32	allFeatures		= ~FEATURE_ARRAYS_OF_ARRAYS;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		// Basic types.
		createRandomCaseGroup(randomGroup, m_context, "scalar_types",	"Scalar types only, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused,										25, 0);
		createRandomCaseGroup(randomGroup, m_context, "vector_types",	"Scalar and vector types only, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|FEATURE_VECTORS,						25, 25);
		createRandomCaseGroup(randomGroup, m_context, "basic_types",	"All basic types, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK, allShaders|allLayouts|unused|allBasicTypes|matFlags,				25, 50);
		createRandomCaseGroup(randomGroup, m_context, "basic_arrays",	"Arrays, per-block buffers",						UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_ARRAYS,	25, 50);

		createRandomCaseGroup(randomGroup, m_context, "basic_instance_arrays",					"Basic instance arrays, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_INSTANCE_ARRAYS,								25, 75);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs",							"Nested structs, per-block buffers",					UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS,										25, 100);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays",					"Nested structs, arrays, per-block buffers",			UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_ARRAYS,							25, 150);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_instance_arrays",			"Nested structs, instance arrays, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_INSTANCE_ARRAYS,				25, 125);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays_instance_arrays",	"Nested structs, instance arrays, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_ARRAYS|FEATURE_INSTANCE_ARRAYS,	25, 175);

		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers",	"All random features, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allFeatures,	50, 200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer",		"All random features, shared buffer",		UniformBlockCase::BUFFERMODE_SINGLE,	allFeatures,	50, 250);
	}
}